

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

idx_t __thiscall
duckdb::IntervalToStringCast::Format(IntervalToStringCast *this,interval_t interval,char *buffer)

{
  int iVar1;
  int32_t iVar2;
  unsigned_long uVar3;
  long lVar4;
  char *buffer_00;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t local_30;
  
  buffer_00 = (char *)interval.micros;
  uVar11 = interval._0_8_;
  local_30 = 0;
  iVar1 = (int)this;
  if (iVar1 != 0) {
    FormatIntervalValue(iVar1 / 0xc,buffer_00,&local_30," year",5);
    FormatIntervalValue(iVar1 % 0xc,buffer_00,&local_30," month",6);
  }
  if ((ulong)this >> 0x20 != 0) {
    FormatIntervalValue((int32_t)((ulong)this >> 0x20),buffer_00,&local_30," day",4);
  }
  if (uVar11 == 0) {
    if (local_30 == 0) {
      builtin_strncpy(buffer_00,"00:00:00",8);
      local_30 = 8;
    }
  }
  else {
    if (local_30 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = local_30 + 1;
      buffer_00[local_30] = ' ';
      local_30 = iVar5;
    }
    if ((long)uVar11 < 0) {
      iVar6 = iVar5 + 1;
      buffer_00[iVar5] = '-';
      local_30 = iVar6;
    }
    else {
      uVar11 = -uVar11;
      iVar6 = iVar5;
    }
    lVar4 = (-uVar11 / 3600000000) * 3600000000 + uVar11;
    lVar9 = SUB168(SEXT816(lVar4) * SEXT816(0x70d59cc6bc5928d7),8) - lVar4;
    uVar10 = (lVar9 >> 0x19) - (lVar9 >> 0x3f);
    lVar4 = uVar10 * 60000000 + lVar4;
    lVar9 = SUB168(SEXT816(lVar4) * SEXT816(-0x431bde82d7b634db),8);
    if (0xfffffff79e3b9800 < uVar11) {
      local_30 = iVar6 + 1;
      buffer_00[iVar6] = '0';
    }
    uVar7 = (lVar9 >> 0x12) - (lVar9 >> 0x3f);
    FormatSignedNumber(-uVar11 / 3600000000,buffer_00,&local_30);
    buffer_00[local_30] = ':';
    if ((int)uVar10 < 10) {
      buffer_00[local_30 + 1] = '0';
      cVar8 = (char)uVar10 + '0';
    }
    else {
      buffer_00[local_30 + 1] =
           duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar10 & 0xffffffff) * 2];
      cVar8 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)((int)uVar10 * 2) + 1]
      ;
    }
    buffer_00[local_30 + 2] = cVar8;
    buffer_00[local_30 + 3] = ':';
    if ((int)uVar7 < 10) {
      buffer_00[local_30 + 4] = '0';
      cVar8 = (char)uVar7 + '0';
    }
    else {
      buffer_00[local_30 + 4] =
           duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar7 & 0xffffffff) * 2];
      cVar8 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uint)((int)uVar7 * 2) + 1];
    }
    buffer_00[local_30 + 5] = cVar8;
    if (uVar7 * -1000000 - lVar4 == 0) {
      local_30 = local_30 + 6;
    }
    else {
      buffer_00[local_30 + 6] = '.';
      local_30 = local_30 + 7;
      iVar1 = NumericCastImpl<int,_long,_false>::Convert(uVar7 * -1000000 - lVar4);
      iVar2 = TimeToStringCast::FormatMicros(iVar1,buffer_00 + local_30);
      uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(6 - iVar2);
      local_30 = uVar3 + local_30;
    }
  }
  return local_30;
}

Assistant:

static idx_t Format(interval_t interval, char buffer[]) {
		idx_t length = 0;
		if (interval.months != 0) {
			int32_t years = interval.months / 12;
			int32_t months = interval.months - years * 12;
			// format the years and months
			FormatIntervalValue(years, buffer, length, " year", 5);
			FormatIntervalValue(months, buffer, length, " month", 6);
		}
		if (interval.days != 0) {
			// format the days
			FormatIntervalValue(interval.days, buffer, length, " day", 4);
		}
		if (interval.micros != 0) {
			if (length != 0) {
				// space if there is already something in the buffer
				buffer[length++] = ' ';
			}
			int64_t micros = interval.micros;
			if (micros < 0) {
				// negative time: append negative sign
				buffer[length++] = '-';
			} else {
				micros = -micros;
			}
			int64_t hour = -(micros / Interval::MICROS_PER_HOUR);
			micros += hour * Interval::MICROS_PER_HOUR;
			int64_t min = -(micros / Interval::MICROS_PER_MINUTE);
			micros += min * Interval::MICROS_PER_MINUTE;
			int64_t sec = -(micros / Interval::MICROS_PER_SEC);
			micros += sec * Interval::MICROS_PER_SEC;
			micros = -micros;

			if (hour < 10) {
				buffer[length++] = '0';
			}
			FormatSignedNumber(hour, buffer, length);
			buffer[length++] = ':';
			FormatTwoDigits(min, buffer, length);
			buffer[length++] = ':';
			FormatTwoDigits(sec, buffer, length);
			if (micros != 0) {
				buffer[length++] = '.';
				auto trailing_zeros = TimeToStringCast::FormatMicros(NumericCast<int32_t>(micros), buffer + length);
				length += NumericCast<idx_t>(6 - trailing_zeros);
			}
		} else if (length == 0) {
			// empty interval: default to 00:00:00
			memcpy(buffer, "00:00:00", 8); // NOLINT
			return 8;
		}
		return length;
	}